

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

void __thiscall PSEngine::apply_rule(PSEngine *this,Rule *p_rule)

{
  RuleApplicationDelta *pRVar1;
  _Base_ptr p_Var2;
  PSEngine *this_00;
  RuleApplicationDelta *delta;
  RuleApplicationDelta *p_delta;
  AbsoluteDirection rule_app_dir;
  function<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>)>
  compute_pattern_match_combinations;
  RuleDelta rule_delta;
  optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  application_positions;
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  application_directions;
  _Rb_tree_color local_190 [2];
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  value_type local_160;
  vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
  local_b8;
  optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
  local_a0;
  _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  local_60;
  
  this_00 = this;
  find_cells_for_rule_application(&local_a0,this,p_rule);
  if ((local_a0.
       super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
       ._M_engaged != true) ||
     (local_a0.
      super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
      ._M_payload._M_value._M_h._M_element_count != 0)) {
    local_160.is_movement_resolution = false;
    local_160.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.movement_deltas.
    super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160.rule_applied._0_5_ = 0xffffffff;
    local_160.rule_applied.direction = None;
    local_160.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.rule_applied.match_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.rule_applied.result_patterns.
    super__Vector_base<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.rule_applied.commands.
    super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_160.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160.rule_applied.deltas.
    super__Vector_base<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_start = (RuleApplicationDelta *)0x0;
    local_160.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_finish = (RuleApplicationDelta *)0x0;
    local_160.rule_application_deltas.
    super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    get_absolute_directions_from_rule_direction
              ((set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
                *)&local_60,this_00,p_rule->direction);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_190[0] = p_Var2[1]._M_color;
        local_178 = (code *)0x0;
        pcStack_170 = (code *)0x0;
        local_188._M_unused._M_object = (void *)0x0;
        local_188._8_8_ = 0;
        local_188._M_unused._M_object = operator_new(0x30);
        *(Rule **)local_188._M_unused._0_8_ = p_rule;
        *(PSEngine **)((long)local_188._M_unused._0_8_ + 8) = this;
        *(_Rb_tree_color **)((long)local_188._M_unused._0_8_ + 0x10) = local_190;
        *(value_type **)((long)local_188._M_unused._0_8_ + 0x18) = &local_160;
        *(optional<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
          **)((long)local_188._M_unused._0_8_ + 0x20) = &local_a0;
        *(_Any_data **)((long)local_188._M_unused._0_8_ + 0x28) = &local_188;
        pcStack_170 = std::
                      _Function_handler<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp:785:103)>
                      ::_M_invoke;
        local_178 = std::
                    _Function_handler<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp:785:103)>
                    ::_M_manager;
        local_b8.
        super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.
        super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_190[1] = 0;
        std::
        _Function_handler<void_(int,_std::vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp:785:103)>
        ::_M_invoke(&local_188,(int *)(local_190 + 1),&local_b8);
        std::
        vector<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
        ::~vector(&local_b8);
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,3);
        }
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
    }
    p_delta = local_160.rule_application_deltas.
              super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = local_160.rule_application_deltas.
             super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_160.rule_application_deltas.
        super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_160.rule_application_deltas.
        super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_160.rule_applied.direction = p_rule->direction;
      local_160.rule_applied.rule_line = p_rule->rule_line;
      local_160.rule_applied.is_late_rule = p_rule->is_late_rule;
      local_160.rule_applied._5_3_ = *(undefined3 *)&p_rule->field_0x5;
      std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::operator=
                (&local_160.rule_applied.match_patterns,&p_rule->match_patterns);
      std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::operator=
                (&local_160.rule_applied.result_patterns,&p_rule->result_patterns);
      std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::operator=
                (&local_160.rule_applied.commands,&p_rule->commands);
      std::vector<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>::operator=
                (&local_160.rule_applied.deltas,&p_rule->deltas);
      std::vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>::push_back
                (&(this->m_turn_history).subturns.
                  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].steps,&local_160);
      p_delta = local_160.rule_application_deltas.
                super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar1 = local_160.rule_application_deltas.
               super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; p_delta != pRVar1; p_delta = p_delta + 1) {
      apply_delta(this,p_delta);
    }
    std::
    _Rb_tree<PSEngine::AbsoluteDirection,_PSEngine::AbsoluteDirection,_std::_Identity<PSEngine::AbsoluteDirection>,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::~_Rb_tree(&local_60);
    std::vector<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>::
    ~vector(&local_160.rule_application_deltas);
    std::vector<CompiledGame::Delta,_std::allocator<CompiledGame::Delta>_>::~vector
              (&local_160.rule_applied.deltas);
    std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector
              (&local_160.rule_applied.commands);
    std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::~vector
              (&local_160.rule_applied.result_patterns);
    std::vector<CompiledGame::Pattern,_std::allocator<CompiledGame::Pattern>_>::~vector
              (&local_160.rule_applied.match_patterns);
    std::vector<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>::~vector
              (&local_160.movement_deltas);
  }
  if (local_a0.
      super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
      ._M_engaged == true) {
    local_a0.
    super__Optional_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::unordered_set<PSVector2i,_std::hash<PSVector2i>,_std::equal_to<PSVector2i>,_std::allocator<PSVector2i>_>_>
    ._M_engaged = false;
    std::
    _Hashtable<PSVector2i,_PSVector2i,_std::allocator<PSVector2i>,_std::__detail::_Identity,_std::equal_to<PSVector2i>,_std::hash<PSVector2i>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<PSVector2i,_PSVector2i,_std::allocator<PSVector2i>,_std::__detail::_Identity,_std::equal_to<PSVector2i>,_std::hash<PSVector2i>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_a0);
  }
  return;
}

Assistant:

void PSEngine::apply_rule(const CompiledGame::Rule& p_rule)
{
    optional<unordered_set<PSVector2i>> application_positions = find_cells_for_rule_application(p_rule);

    if(application_positions.has_value() && application_positions.value().size() == 0)
    {
        //there is currently no cell where this rule could be applied in the level
        return;
    }

    RuleDelta rule_delta;

    set<AbsoluteDirection> application_directions = get_absolute_directions_from_rule_direction(p_rule.direction);

    for(auto rule_app_dir : application_directions)
    {
        std::function<void(int,vector<PatternMatchInformation>)> compute_pattern_match_combinations = [&](int rule_pattern_index, vector<PatternMatchInformation> current_match_combination){
            if(rule_pattern_index >= p_rule.match_patterns.size())
            {
                RuleApplicationDelta application_delta = translate_rule_delta(p_rule, rule_app_dir, current_match_combination);

                //do not add exactly identical deltas
                //todo this could and should probably done by the compiler (altough maybe not all equalities could be caught by the compiler)
                bool add_delta = true;
                string matched_delta_app_str = "";
                for(const auto& app_delta : rule_delta.rule_application_deltas)
                {
                    if(app_delta == application_delta)
                    {
                        add_delta = false;
                        matched_delta_app_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                        for(const auto& m : current_match_combination)
                        {
                            matched_delta_app_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                        }

                        break;
                    }
                }

                string new_rule_match_str = enum_to_str(rule_app_dir, to_absolute_direction).value_or("error");
                for(const auto& m : current_match_combination)
                {
                    new_rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                }

                if(add_delta)
                {
                    PS_LOG("Matched the rule at "+new_rule_match_str);
                    rule_delta.rule_application_deltas.push_back(application_delta);
                }
                else
                {
                    PS_LOG("Skipping match at "+new_rule_match_str+" since it equals match at "+matched_delta_app_str);

                }
            }
            else
            {
                //todo: for now only send the application position for the first pattern, this is a bit hacky
                vector<PatternMatchInformation> matched_patterns = match_pattern(p_rule.match_patterns[rule_pattern_index], rule_app_dir, (rule_pattern_index == 0) ? application_positions : nullopt);

                for(const auto& match : matched_patterns)
                {
                    vector<PatternMatchInformation> new_match_combination = current_match_combination;
                    new_match_combination.push_back(match);

                    compute_pattern_match_combinations(rule_pattern_index+1,new_match_combination);
                }
            }

        };

        compute_pattern_match_combinations(0, vector<PatternMatchInformation>());
    }

    //todo check if there is collision between deltas

    if(rule_delta.rule_application_deltas.size() > 0)
    {
        rule_delta.rule_applied = p_rule;
        m_turn_history.subturns.back().steps.push_back(rule_delta);
    }

    for(const RuleApplicationDelta& delta : rule_delta.rule_application_deltas)
    {
        apply_delta(delta);
    }
}